

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.h
# Opt level: O3

void __thiscall
llvm::
formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::formatv_object(formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *this,StringRef Fmt,
                tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *Params)

{
  pointer ppfVar1;
  pointer ppfVar2;
  initializer_list<llvm::detail::format_adapter_*> __l;
  _Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false> *local_68;
  _Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_false> *local_60;
  _Head_base<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false> *local_58;
  tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  vector<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_> local_48;
  allocator_type local_21;
  
  formatv_object_base::formatv_object_base(&this->super_formatv_object_base,Fmt,4);
  std::
  _Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Tuple_impl((_Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&this->Parameters,
                (_Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)Params);
  local_68 = &(this->Parameters).
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>;
  (this->Parameters).
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>._M_head_impl.
  super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d78170;
  (this->Parameters).
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>._M_head_impl.
  Item = (Params->
         super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
         _M_head_impl.Item;
  local_60 = &(this->Parameters).
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_false>;
  local_58 = &(this->Parameters).
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>
  ;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_68;
  local_50 = &this->Parameters;
  std::vector<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>::
  vector(&local_48,__l,&local_21);
  ppfVar1 = (this->super_formatv_object_base).Adapters.
            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppfVar2 = (this->super_formatv_object_base).Adapters.
            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_formatv_object_base).Adapters.
  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_formatv_object_base).Adapters.
  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_formatv_object_base).Adapters.
  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppfVar1 != (pointer)0x0) {
    operator_delete(ppfVar1,(long)ppfVar2 - (long)ppfVar1);
    if (local_48.
        super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

formatv_object(StringRef Fmt, Tuple &&Params)
      : formatv_object_base(Fmt, std::tuple_size<Tuple>::value),
        Parameters(std::move(Params)) {
    Adapters = apply_tuple(create_adapters(), Parameters);
  }